

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O0

ssize_t tnt_io_sendv(tnt_stream_net *s,iovec *iov,int count)

{
  ssize_t sVar1;
  ssize_t r;
  tnt_stream_net *ptStack_30;
  int i;
  size_t size;
  int count_local;
  iovec *iov_local;
  tnt_stream_net *s_local;
  
  if ((s->sbuf).buf == (char *)0x0) {
    s_local = (tnt_stream_net *)tnt_io_sendv_raw(s,iov,count,1);
  }
  else {
    ptStack_30 = (tnt_stream_net *)0x0;
    for (r._4_4_ = 0; r._4_4_ < count; r._4_4_ = r._4_4_ + 1) {
      ptStack_30 = (tnt_stream_net *)((long)&(ptStack_30->opt).uristr + iov[r._4_4_].iov_len);
    }
    if ((tnt_stream_net *)(s->sbuf).size < ptStack_30) {
      s->error = TNT_EBIG;
      s_local = (tnt_stream_net *)0xffffffffffffffff;
    }
    else if ((s->sbuf).size < (long)&(ptStack_30->opt).uristr + (s->sbuf).off) {
      sVar1 = tnt_io_send_raw(s,(s->sbuf).buf,(s->sbuf).off,1);
      if (sVar1 == -1) {
        s_local = (tnt_stream_net *)0xffffffffffffffff;
      }
      else {
        (s->sbuf).off = 0;
        tnt_io_sendv_put(s,iov,count);
        s_local = ptStack_30;
      }
    }
    else {
      tnt_io_sendv_put(s,iov,count);
      s_local = ptStack_30;
    }
  }
  return (ssize_t)s_local;
}

Assistant:

ssize_t
tnt_io_sendv(struct tnt_stream_net *s, struct iovec *iov, int count)
{
	if (s->sbuf.buf == NULL)
		return tnt_io_sendv_raw(s, iov, count, 1);
	size_t size = 0;
	int i;
	for (i = 0 ; i < count ; i++)
		size += iov[i].iov_len;
	if (size > s->sbuf.size) {
		s->error = TNT_EBIG;
		return -1;
	}
	if ((s->sbuf.off + size) <= s->sbuf.size) {
		tnt_io_sendv_put(s, iov, count);
		return size;
	}
	ssize_t r = tnt_io_send_raw(s, s->sbuf.buf, s->sbuf.off, 1);
	if (r == -1)
		return -1;
	s->sbuf.off = 0;
	tnt_io_sendv_put(s, iov, count);
	return size;
}